

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall google::protobuf::UnknownFieldSet::DeleteByNumber(UnknownFieldSet *this,int number)

{
  anon_union_8_5_2195ba05_for_data_ aVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  pointer pUVar5;
  Arena *pAVar6;
  pointer pUVar7;
  int index;
  
  iVar3 = internal::SooRep::size
                    ((SooRep *)this,
                     (undefined1  [16])
                     ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  index = 0;
  if (0 < iVar3) {
    iVar3 = 0;
    do {
      pUVar5 = RepeatedField<google::protobuf::UnknownField>::Mutable(&this->fields_,iVar3);
      if (pUVar5->number_ == number) {
        pAVar6 = arena(this);
        if (pAVar6 == (Arena *)0x0) {
          UnknownField::Delete(pUVar5);
        }
      }
      else {
        if (iVar3 != index) {
          pUVar5 = RepeatedField<google::protobuf::UnknownField>::Mutable(&this->fields_,iVar3);
          pUVar7 = RepeatedField<google::protobuf::UnknownField>::Mutable(&this->fields_,index);
          uVar2 = pUVar5->type_;
          aVar1 = pUVar5->data_;
          pUVar7->number_ = pUVar5->number_;
          pUVar7->type_ = uVar2;
          pUVar7->data_ = aVar1;
        }
        index = index + 1;
      }
      iVar3 = iVar3 + 1;
      iVar4 = internal::SooRep::size
                        ((SooRep *)this,
                         (undefined1  [16])
                         ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4
                         ) == (undefined1  [16])0x0);
    } while (iVar3 < iVar4);
  }
  RepeatedField<google::protobuf::UnknownField>::Truncate(&this->fields_,index);
  return;
}

Assistant:

void UnknownFieldSet::DeleteByNumber(int number) {
  int left = 0;  // The number of fields left after deletion.
  for (int i = 0; i < fields_.size(); ++i) {
    UnknownField* field = &(fields_)[i];
    if (field->number() == number) {
      if (arena() == nullptr) {
        field->Delete();
      }
    } else {
      if (i != left) {
        (fields_)[left] = (fields_)[i];
      }
      ++left;
    }
  }
  fields_.Truncate(left);
}